

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::copyTexSubImage1D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int x,int y,int width)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int b;
  PixelBufferAccess *pPVar4;
  ConstPixelBufferAccess *this_00;
  void *local_d8;
  Vec4 local_c4;
  int local_b4;
  undefined1 local_b0 [4];
  int xo;
  PixelBufferAccess dst;
  Texture1D *texture;
  undefined1 local_58 [8];
  MultisampleConstPixelBufferAccess src;
  TextureUnit *unit;
  int y_local;
  int x_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  src.m_access.m_data =
       std::
       vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
       ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  getReadColorbuffer((MultisamplePixelBufferAccess *)&texture,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_58,(MultisamplePixelBufferAccess *)&texture)
  ;
  do {
    if (xoffset < 0) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if (width < 0) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    bVar1 = isEmpty((MultisampleConstPixelBufferAccess *)local_58);
    if (bVar1) {
      setError(this,0x502);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (target == 0xde0) {
    if (*src.m_access.m_data == 0) {
      local_d8 = (void *)((long)src.m_access.m_data + 0x30);
    }
    else {
      local_d8 = *src.m_access.m_data;
    }
    dst.super_ConstPixelBufferAccess.m_data = local_d8;
    do {
      bVar1 = rc::Texture1D::hasLevel((Texture1D *)dst.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar4 = rc::Texture1D::getLevel((Texture1D *)dst.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_b0,pPVar4);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_b0);
      if (iVar3 < xoffset + width) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    for (local_b4 = 0; local_b4 < width; local_b4 = local_b4 + 1) {
      iVar3 = x + local_b4;
      this_00 = rr::MultisampleConstPixelBufferAccess::raw
                          ((MultisampleConstPixelBufferAccess *)local_58);
      b = tcu::ConstPixelBufferAccess::getHeight(this_00);
      bVar1 = de::inBounds<int>(iVar3,0,b);
      if (bVar1) {
        rr::resolveMultisamplePixel
                  ((rr *)&local_c4,(MultisampleConstPixelBufferAccess *)local_58,x + local_b4,y);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_b0,&local_c4,local_b4 + xoffset,0,0);
      }
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::copyTexSubImage1D (deUint32 target, int level, int xoffset, int x, int y, int width)
{
	TextureUnit&							unit	= m_textureUnits[m_activeTexture];
	rr::MultisampleConstPixelBufferAccess	src		= getReadColorbuffer();

	RC_IF_ERROR(xoffset < 0,	GL_INVALID_VALUE,		RC_RET_VOID);
	RC_IF_ERROR(width < 0,		GL_INVALID_VALUE,		RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src),	GL_INVALID_OPERATION,	RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		Texture1D& texture = unit.tex1DBinding ? *unit.tex1DBinding : unit.default1DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width > dst.getWidth(), GL_INVALID_VALUE, RC_RET_VOID);

		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo+xoffset, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}